

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

shared_ptr<duckdb::ColumnData,_true> __thiscall
duckdb::ColumnData::CreateColumn
          (ColumnData *this,BlockManager *block_manager,DataTableInfo *info,idx_t column_index,
          idx_t start_row,LogicalType *type,optional_ptr<duckdb::ColumnData,_true> parent)

{
  PhysicalType PVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ColumnData,_true> sVar3;
  undefined1 local_40 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_40._16_8_ = parent.ptr;
  PVar1 = type->physical_type_;
  local_40._0_8_ = start_row;
  local_40._8_8_ = column_index;
  if (PVar1 == LIST) {
    make_shared_ptr<duckdb::ListColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
              ((BlockManager *)(local_40 + 0x18),(DataTableInfo *)block_manager,
               (unsigned_long *)info,(unsigned_long *)(local_40 + 8),(LogicalType *)local_40,
               (optional_ptr<duckdb::ColumnData,_true> *)type);
  }
  else if (PVar1 == ARRAY) {
    make_shared_ptr<duckdb::ArrayColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
              ((BlockManager *)(local_40 + 0x18),(DataTableInfo *)block_manager,
               (unsigned_long *)info,(unsigned_long *)(local_40 + 8),(LogicalType *)local_40,
               (optional_ptr<duckdb::ColumnData,_true> *)type);
  }
  else if (PVar1 == STRUCT) {
    make_shared_ptr<duckdb::StructColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
              ((BlockManager *)(local_40 + 0x18),(DataTableInfo *)block_manager,
               (unsigned_long *)info,(unsigned_long *)(local_40 + 8),(LogicalType *)local_40,
               (optional_ptr<duckdb::ColumnData,_true> *)type);
  }
  else if (type->id_ == VALIDITY) {
    optional_ptr<duckdb::ColumnData,_true>::operator*
              ((optional_ptr<duckdb::ColumnData,_true> *)(local_40 + 0x10));
    make_shared_ptr<duckdb::ValidityColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::ColumnData&>
              ((BlockManager *)(local_40 + 0x18),(DataTableInfo *)block_manager,
               (unsigned_long *)info,(unsigned_long *)(local_40 + 8),(ColumnData *)local_40);
  }
  else {
    make_shared_ptr<duckdb::StandardColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
              ((BlockManager *)(local_40 + 0x18),(DataTableInfo *)block_manager,
               (unsigned_long *)info,(unsigned_long *)(local_40 + 8),(LogicalType *)local_40,
               (optional_ptr<duckdb::ColumnData,_true> *)type);
  }
  _Var2._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_ColumnData = (_func_int **)local_40._24_8_;
  this->start = (idx_t)_Var2._M_pi;
  local_40._24_8_ = (BlockManager *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  sVar3.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::ColumnData,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnData> ColumnData::CreateColumn(BlockManager &block_manager, DataTableInfo &info, idx_t column_index,
                                                idx_t start_row, const LogicalType &type,
                                                optional_ptr<ColumnData> parent) {
	return CreateColumnInternal<shared_ptr<ColumnData>, SharedConstructor>(block_manager, info, column_index, start_row,
	                                                                       type, parent);
}